

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O0

void * FilterRender::doColor
                 (void *data,uint width,uint height,u_int8_t r,u_int8_t g,u_int8_t b,u_int8_t a)

{
  byte *pbVar1;
  code *pcVar2;
  ulong uVar3;
  void *pvVar4;
  double *pdVar5;
  uint local_9c;
  uint local_98;
  int j_4;
  int i_4;
  int k_1;
  int j_3;
  int i_3;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double nw_sum;
  uint local_48;
  int j_2;
  int i_2;
  int k;
  int j_1;
  int i_1;
  uchar *p;
  int j;
  int i;
  uchar ***map;
  uint local_18;
  u_int8_t b_local;
  u_int8_t g_local;
  uint uStack_14;
  u_int8_t r_local;
  uint height_local;
  uint width_local;
  void *data_local;
  
  uVar3 = SUB168(ZEXT416(height) * ZEXT816(8),0);
  if (SUB168(ZEXT416(height) * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  map._5_1_ = b;
  map._6_1_ = g;
  map._7_1_ = r;
  local_18 = height;
  uStack_14 = width;
  _height_local = data;
  _j = operator_new__(uVar3);
  for (p._4_4_ = 0; p._4_4_ < local_18; p._4_4_ = p._4_4_ + 1) {
    uVar3 = SUB168(ZEXT416(uStack_14) * ZEXT816(8),0);
    if (SUB168(ZEXT416(uStack_14) * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)((long)_j + (long)(int)p._4_4_ * 8) = pvVar4;
    for (p._0_4_ = 0; (uint)p < uStack_14; p._0_4_ = (uint)p + 1) {
      pvVar4 = operator_new__(4);
      *(void **)(*(long *)((long)_j + (long)(int)p._4_4_ * 8) + (long)(int)(uint)p * 8) = pvVar4;
    }
  }
  _j_1 = _height_local;
  for (k = 0; (uint)k < local_18; k = k + 1) {
    for (i_2 = 0; (uint)i_2 < uStack_14; i_2 = i_2 + 1) {
      for (j_2 = 0; j_2 < 4; j_2 = j_2 + 1) {
        *(undefined1 *)(*(long *)(*(long *)((long)_j + (long)k * 8) + (long)i_2 * 8) + (long)j_2) =
             *(undefined1 *)((long)_j_1 + (long)j_2);
      }
      _j_1 = (void *)((long)_j_1 + 4);
    }
  }
  for (local_48 = 0; local_48 < local_18; local_48 = local_48 + 1) {
    for (nw_sum._4_4_ = 0; nw_sum._4_4_ < uStack_14; nw_sum._4_4_ = nw_sum._4_4_ + 1) {
      pbVar1 = *(byte **)(*(long *)((long)_j + (long)(int)local_48 * 8) +
                         (long)(int)nw_sum._4_4_ * 8);
      local_58 = ((double)*pbVar1 + (double)pbVar1[1] + (double)pbVar1[2]) /
                 (double)((uint)map._7_1_ + (uint)map._6_1_ + (uint)map._5_1_);
      local_60 = 255.0;
      local_68 = local_58 * (double)map._5_1_;
      pdVar5 = std::min<double>(&local_60,&local_68);
      **(undefined1 **)(*(long *)((long)_j + (long)(int)local_48 * 8) + (long)(int)nw_sum._4_4_ * 8)
           = (char)(int)*pdVar5;
      local_70 = 255.0;
      local_78 = local_58 * (double)map._6_1_;
      pdVar5 = std::min<double>(&local_70,&local_78);
      *(char *)(*(long *)(*(long *)((long)_j + (long)(int)local_48 * 8) +
                         (long)(int)nw_sum._4_4_ * 8) + 1) = (char)(int)*pdVar5;
      local_80 = 255.0;
      _j_3 = local_58 * (double)map._7_1_;
      pdVar5 = std::min<double>(&local_80,(double *)&j_3);
      *(char *)(*(long *)(*(long *)((long)_j + (long)(int)local_48 * 8) +
                         (long)(int)nw_sum._4_4_ * 8) + 2) = (char)(int)*pdVar5;
    }
  }
  _j_1 = _height_local;
  for (k_1 = 0; (uint)k_1 < local_18; k_1 = k_1 + 1) {
    for (i_4 = 0; (uint)i_4 < uStack_14; i_4 = i_4 + 1) {
      for (j_4 = 0; j_4 < 4; j_4 = j_4 + 1) {
        *(undefined1 *)((long)_j_1 + (long)j_4) =
             *(undefined1 *)
              (*(long *)(*(long *)((long)_j + (long)k_1 * 8) + (long)i_4 * 8) + (long)j_4);
      }
      _j_1 = (void *)((long)_j_1 + 4);
    }
  }
  for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
    for (local_9c = 0; local_9c < uStack_14; local_9c = local_9c + 1) {
      pvVar4 = *(void **)(*(long *)((long)_j + (long)(int)local_98 * 8) + (long)(int)local_9c * 8);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
    }
    pvVar4 = *(void **)((long)_j + (long)(int)local_98 * 8);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  if (_j != (void *)0x0) {
    operator_delete__(_j);
  }
  _j = (void *)0x0;
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void* FilterRender::doColor(void *data, uint width, uint height, u_int8_t r, u_int8_t g, u_int8_t b, u_int8_t a) {
	//std::cerr << "fuckyou" << std::endl;
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			double nw_sum = (1.*map[i][j][0] + map[i][j][1] + map[i][j][2])/(r+g+b);
				map[i][j][0] = std::min(255., nw_sum*b);
				map[i][j][1] = std::min(255., nw_sum*g);
				map[i][j][2] = std::min(255., nw_sum*r);
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}